

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typechecker.c
# Opt level: O0

int raviX_ast_typecheck(CompilerState *compiler_state)

{
  AstNode *func;
  int iVar1;
  int rc;
  AstNode *main_function;
  CompilerState *compiler_state_local;
  
  func = compiler_state->main_function;
  raviX_buffer_reset(&compiler_state->error_message);
  iVar1 = _setjmp((__jmp_buf_tag *)compiler_state->env);
  if (iVar1 == 0) {
    typecheck_function(compiler_state,func);
  }
  return iVar1;
}

Assistant:

int raviX_ast_typecheck(CompilerState *compiler_state)
{
	AstNode *main_function = compiler_state->main_function;
	raviX_buffer_reset(&compiler_state->error_message);
	int rc = setjmp(compiler_state->env);
	if (rc == 0) {
		typecheck_function(compiler_state, main_function);
	}
	return rc;
}